

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O3

ze_image_type_t to_image_type(string *type)

{
  int iVar1;
  ze_image_type_t zVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)type);
  if (iVar1 == 0) {
    zVar2 = ZE_IMAGE_TYPE_1D;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)type);
    if (iVar1 == 0) {
      zVar2 = ZE_IMAGE_TYPE_2D;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)type);
      if (iVar1 == 0) {
        zVar2 = ZE_IMAGE_TYPE_3D;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)type);
        if (iVar1 == 0) {
          zVar2 = ZE_IMAGE_TYPE_1DARRAY;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)type);
          if (iVar1 == 0) {
            zVar2 = ZE_IMAGE_TYPE_2DARRAY;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Unknown ze_image_type_t value: ",0x1f);
            zVar2 = ~ZE_IMAGE_TYPE_1D;
          }
        }
      }
    }
  }
  return zVar2;
}

Assistant:

ze_image_type_t to_image_type(const std::string type) {
  if (type == "1D") {
    return ZE_IMAGE_TYPE_1D;
  } else if (type == "2D") {
    return ZE_IMAGE_TYPE_2D;
  } else if (type == "3D") {
    return ZE_IMAGE_TYPE_3D;
  } else if (type == "1DARRAY") {
    return ZE_IMAGE_TYPE_1DARRAY;
  } else if (type == "2DARRAY") {
    return ZE_IMAGE_TYPE_2DARRAY;
  } else {
    std::cout << "Unknown ze_image_type_t value: ";
    return (static_cast<ze_image_type_t>(-1));
  }
}